

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O1

void __thiscall TasgridWrapper::outputQuadrature(TasgridWrapper *this)

{
  int iVar1;
  long lVar2;
  uint *puVar3;
  uint rows;
  pointer __src;
  ulong uVar4;
  vector<double,_std::allocator<double>_> weights;
  Data2D<double> combined;
  vector<double,_std::allocator<double>_> pnts;
  allocator_type local_91;
  string *local_90;
  vector<double,_std::allocator<double>_> local_88;
  long local_70;
  long local_68;
  vector<double,_std::allocator<double>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  
  if (((this->outfilename)._M_string_length != 0) || (this->printCout == true)) {
    lVar2 = *(long *)&this->field_0x8;
    if (lVar2 == 0) {
      rows = 0;
    }
    else {
      puVar3 = (uint *)(lVar2 + 0x20);
      if (*(long *)(lVar2 + 0x28) == *(long *)(lVar2 + 0x30)) {
        puVar3 = (uint *)(lVar2 + 0x48);
      }
      rows = *puVar3;
    }
    TasGrid::TasmanianSparseGrid::getPoints(&local_48,&this->grid);
    __src = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
    iVar1 = this->num_dimensions;
    TasGrid::TasmanianSparseGrid::getQuadratureWeights(&local_88,&this->grid);
    local_70 = (long)this->num_dimensions + 1;
    local_68 = (long)(int)rows;
    std::vector<double,_std::allocator<double>_>::vector(&local_60,local_70 * local_68,&local_91);
    local_90 = &this->outfilename;
    if (0 < (int)rows) {
      uVar4 = 0;
      do {
        local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[local_70 * uVar4] =
             local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar4];
        if (0 < (long)this->num_dimensions) {
          memmove(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + local_70 * uVar4 + 1,__src,
                  (long)this->num_dimensions << 3);
        }
        uVar4 = uVar4 + 1;
        __src = __src + iVar1;
      } while (rows != uVar4);
    }
    writeMatrix(this,local_90,rows,this->num_dimensions + 1,
                local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start);
    printMatrix(this,rows,this->num_dimensions + 1,
                local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start,false);
    if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (double *)0x0) {
      operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void TasgridWrapper::outputQuadrature() const{
    if (outfilename.empty() and not printCout) return;
    int num_points = grid.getNumPoints();
    auto pnts  = grid.getPoints();
    Utils::Wrapper2D<double> points(num_dimensions, pnts.data());
    auto weights = grid.getQuadratureWeights();
    Data2D<double> combined(num_dimensions + 1, num_points);
    for(int i=0; i<num_points; i++){
        combined.getStrip(i)[0] = weights[i];
        std::copy_n(points.getStrip(i), num_dimensions, &(combined.getStrip(i)[1]));
    }
    writeMatrix(outfilename, num_points, num_dimensions+1, combined.getStrip(0));
    printMatrix(num_points, num_dimensions+1, combined.getStrip(0));
}